

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst_sse4.c
# Opt level: O2

int64_t av1_lowbd_pixel_proj_error_sse4_1
                  (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
                  int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int *xq,
                  sgr_params_type *params)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  byte *pbVar6;
  uint uVar7;
  byte *pbVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  int iVar14;
  int iVar15;
  undefined1 auVar13 [16];
  int iVar16;
  undefined1 in_XMM2 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM5 [16];
  short sVar29;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      lVar2 = 0;
      if (height < 1) {
        height = 0;
      }
      auVar17 = (undefined1  [16])0x0;
      for (iVar3 = 0; iVar3 != height; iVar3 = iVar3 + 1) {
        pbVar6 = dat8;
        pbVar8 = src8;
        for (lVar11 = 0; lVar11 <= width + -0x10; lVar11 = lVar11 + 0x10) {
          auVar21 = *(undefined1 (*) [16])(dat8 + lVar11);
          auVar24 = *(undefined1 (*) [16])(src8 + lVar11);
          auVar30 = pmovzxbw(in_XMM4,auVar21);
          in_XMM5 = pmovzxbw(in_XMM5,auVar24);
          auVar36._0_2_ = auVar30._0_2_ - in_XMM5._0_2_;
          auVar36._2_2_ = auVar30._2_2_ - in_XMM5._2_2_;
          auVar36._4_2_ = auVar30._4_2_ - in_XMM5._4_2_;
          auVar36._6_2_ = auVar30._6_2_ - in_XMM5._6_2_;
          auVar36._8_2_ = auVar30._8_2_ - in_XMM5._8_2_;
          auVar36._10_2_ = auVar30._10_2_ - in_XMM5._10_2_;
          auVar36._12_2_ = auVar30._12_2_ - in_XMM5._12_2_;
          auVar36._14_2_ = auVar30._14_2_ - in_XMM5._14_2_;
          auVar30._0_2_ = (ushort)auVar21[8] - (ushort)auVar24[8];
          auVar30._2_2_ = (ushort)auVar21[9] - (ushort)auVar24[9];
          auVar30._4_2_ = (ushort)auVar21[10] - (ushort)auVar24[10];
          auVar30._6_2_ = (ushort)auVar21[0xb] - (ushort)auVar24[0xb];
          auVar30._8_2_ = (ushort)auVar21[0xc] - (ushort)auVar24[0xc];
          auVar30._10_2_ = (ushort)auVar21[0xd] - (ushort)auVar24[0xd];
          auVar30._12_2_ = (ushort)auVar21[0xe] - (ushort)auVar24[0xe];
          auVar30._14_2_ = (ushort)auVar21[0xf] - (ushort)auVar24[0xf];
          auVar21 = pmaddwd(auVar36,auVar36);
          in_XMM2 = pmaddwd(auVar30,auVar30);
          iVar14 = auVar17._4_4_;
          iVar15 = auVar17._8_4_;
          iVar16 = auVar17._12_4_;
          auVar17._0_4_ = auVar21._0_4_ + auVar17._0_4_ + in_XMM2._0_4_;
          auVar17._4_4_ = auVar21._4_4_ + iVar14 + in_XMM2._4_4_;
          auVar17._8_4_ = auVar21._8_4_ + iVar15 + in_XMM2._8_4_;
          auVar17._12_4_ = auVar21._12_4_ + iVar16 + in_XMM2._12_4_;
          pbVar8 = pbVar8 + 0x10;
          pbVar6 = pbVar6 + 0x10;
          in_XMM4 = auVar17;
        }
        for (; lVar11 < width; lVar11 = lVar11 + 1) {
          lVar2 = lVar2 + ((ulong)*pbVar6 - (ulong)*pbVar8) * ((ulong)*pbVar6 - (ulong)*pbVar8);
          pbVar8 = pbVar8 + 1;
          pbVar6 = pbVar6 + 1;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
      }
      auVar24 = pmovsxdq(in_XMM2,auVar17);
      auVar21._0_8_ = auVar17._8_8_;
      auVar21._8_4_ = auVar17._8_4_;
      auVar21._12_4_ = auVar17._12_4_;
      auVar17 = pmovsxdq(auVar21,auVar21);
      lVar11 = auVar17._0_8_ + auVar24._0_8_;
      lVar12 = auVar17._8_8_ + auVar24._8_8_;
      goto LAB_00355ef3;
    }
    lVar2 = 4;
    flt0 = flt1;
    flt0_stride = flt1_stride;
  }
  else {
    if (0 < params->r[1]) {
      uVar7 = xq[1] << 0x10 | *xq & 0xffffU;
      auVar13._4_4_ = uVar7;
      auVar13._0_4_ = uVar7;
      auVar13._8_4_ = uVar7;
      auVar13._12_4_ = uVar7;
      if (height < 1) {
        height = 0;
      }
      lVar11 = 0;
      lVar12 = 0;
      auVar17 = pmovsxwd(in_XMM2,0x400040004000400);
      lVar2 = 0;
      for (iVar3 = 0; iVar3 != height; iVar3 = iVar3 + 1) {
        auVar18 = (undefined1  [16])0x0;
        lVar4 = 0;
        pbVar6 = src8;
        pbVar8 = dat8;
        piVar9 = flt0;
        piVar10 = flt1;
        while( true ) {
          auVar19._12_4_ = auVar18._12_4_;
          iVar14 = auVar18._4_4_;
          auVar19._8_4_ = auVar18._8_4_;
          if (width + -8 < lVar4) break;
          auVar21 = pmovzxbw(in_XMM4,*(undefined8 *)(dat8 + lVar4));
          in_XMM5 = pmovzxbw(in_XMM5,*(undefined8 *)(src8 + lVar4));
          auVar24 = packssdw(*(undefined1 (*) [16])(flt0 + lVar4),
                             *(undefined1 (*) [16])(flt0 + lVar4 + 4));
          auVar30 = packssdw(*(undefined1 (*) [16])(flt1 + lVar4),
                             *(undefined1 (*) [16])(flt1 + lVar4 + 4));
          auVar36 = psllw(auVar21,4);
          sVar29 = auVar24._6_2_ - auVar36._6_2_;
          auVar37._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar30._6_2_ - auVar36._6_2_,sVar29),
                                  auVar30._4_2_ - auVar36._4_2_),
                         CONCAT22(auVar24._4_2_ - auVar36._4_2_,sVar29)) >> 0x10);
          auVar37._6_2_ = auVar30._2_2_ - auVar36._2_2_;
          auVar37._4_2_ = auVar24._2_2_ - auVar36._2_2_;
          auVar37._2_2_ = auVar30._0_2_ - auVar36._0_2_;
          auVar37._0_2_ = auVar24._0_2_ - auVar36._0_2_;
          auVar38 = pmaddwd(auVar37,auVar13);
          auVar25._2_2_ = auVar30._8_2_ - auVar36._8_2_;
          auVar25._0_2_ = auVar24._8_2_ - auVar36._8_2_;
          auVar25._4_2_ = auVar24._10_2_ - auVar36._10_2_;
          auVar25._6_2_ = auVar30._10_2_ - auVar36._10_2_;
          auVar25._8_2_ = auVar24._12_2_ - auVar36._12_2_;
          auVar25._10_2_ = auVar30._12_2_ - auVar36._12_2_;
          auVar25._12_2_ = auVar24._14_2_ - auVar36._14_2_;
          auVar25._14_2_ = auVar30._14_2_ - auVar36._14_2_;
          auVar24 = pmaddwd(auVar25,auVar13);
          auVar39._0_4_ = auVar38._0_4_ + auVar17._0_4_ >> 0xb;
          auVar39._4_4_ = auVar38._4_4_ + auVar17._4_4_ >> 0xb;
          auVar39._8_4_ = auVar38._8_4_ + auVar17._8_4_ >> 0xb;
          auVar39._12_4_ = auVar38._12_4_ + auVar17._12_4_ >> 0xb;
          auVar26._0_4_ = auVar24._0_4_ + auVar17._0_4_ >> 0xb;
          auVar26._4_4_ = auVar24._4_4_ + auVar17._4_4_ >> 0xb;
          auVar26._8_4_ = auVar24._8_4_ + auVar17._8_4_ >> 0xb;
          auVar26._12_4_ = auVar24._12_4_ + auVar17._12_4_ >> 0xb;
          auVar24 = packssdw(auVar39,auVar26);
          auVar22._0_2_ = (auVar21._0_2_ - in_XMM5._0_2_) + auVar24._0_2_;
          auVar22._2_2_ = (auVar21._2_2_ - in_XMM5._2_2_) + auVar24._2_2_;
          auVar22._4_2_ = (auVar21._4_2_ - in_XMM5._4_2_) + auVar24._4_2_;
          auVar22._6_2_ = (auVar21._6_2_ - in_XMM5._6_2_) + auVar24._6_2_;
          auVar22._8_2_ = (auVar21._8_2_ - in_XMM5._8_2_) + auVar24._8_2_;
          auVar22._10_2_ = (auVar21._10_2_ - in_XMM5._10_2_) + auVar24._10_2_;
          auVar22._12_2_ = (auVar21._12_2_ - in_XMM5._12_2_) + auVar24._12_2_;
          auVar22._14_2_ = (auVar21._14_2_ - in_XMM5._14_2_) + auVar24._14_2_;
          in_XMM4 = pmaddwd(auVar22,auVar22);
          auVar18._0_4_ = auVar18._0_4_ + in_XMM4._0_4_;
          auVar18._4_4_ = iVar14 + in_XMM4._4_4_;
          auVar18._8_4_ = auVar19._8_4_ + in_XMM4._8_4_;
          auVar18._12_4_ = auVar19._12_4_ + in_XMM4._12_4_;
          lVar4 = lVar4 + 8;
          pbVar6 = pbVar6 + 8;
          piVar10 = piVar10 + 8;
          piVar9 = piVar9 + 8;
          pbVar8 = pbVar8 + 8;
        }
        for (; lVar4 < width; lVar4 = lVar4 + 1) {
          bVar1 = *pbVar8;
          lVar5 = (long)(int)(((uint)bVar1 - (uint)*pbVar6) +
                             ((int)((*piVar9 + (uint)bVar1 * -0x10) * *xq +
                                    (*piVar10 + (uint)bVar1 * -0x10) * xq[1] + 0x400) >> 0xb));
          lVar2 = lVar2 + lVar5 * lVar5;
          pbVar6 = pbVar6 + 1;
          piVar10 = piVar10 + 1;
          piVar9 = piVar9 + 1;
          pbVar8 = pbVar8 + 1;
        }
        dat8 = dat8 + dat_stride;
        src8 = src8 + src_stride;
        in_XMM4 = pmovsxdq(in_XMM4,auVar18);
        auVar19._0_8_ = auVar18._8_8_;
        auVar21 = pmovsxdq(auVar19,auVar19);
        lVar11 = lVar11 + in_XMM4._0_8_ + auVar21._0_8_;
        lVar12 = lVar12 + in_XMM4._8_8_ + auVar21._8_8_;
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
      }
      goto LAB_00355ef3;
    }
    lVar2 = 0;
  }
  uVar7 = *(uint *)((long)xq + lVar2);
  iVar3 = (uVar7 & 0xffff) + uVar7 * -0x100000;
  auVar24._4_4_ = iVar3;
  auVar24._0_4_ = iVar3;
  auVar24._8_4_ = iVar3;
  auVar24._12_4_ = iVar3;
  lVar2 = 0;
  if (height < 1) {
    height = 0;
  }
  lVar11 = 0;
  lVar12 = 0;
  auVar17 = pmovsxwd(in_XMM2,0x400040004000400);
  for (iVar3 = 0; iVar3 != height; iVar3 = iVar3 + 1) {
    auVar38 = (undefined1  [16])0x0;
    lVar4 = 0;
    pbVar6 = dat8;
    piVar9 = flt0;
    pbVar8 = src8;
    while( true ) {
      auVar20._12_4_ = auVar38._12_4_;
      iVar14 = auVar38._4_4_;
      auVar20._8_4_ = auVar38._8_4_;
      if (width + -8 < lVar4) break;
      auVar21 = pmovzxbw(in_XMM4,*(undefined8 *)(dat8 + lVar4));
      in_XMM5 = pmovzxbw(in_XMM5,*(undefined8 *)(src8 + lVar4));
      auVar30 = packssdw(*(undefined1 (*) [16])(flt0 + lVar4),
                         *(undefined1 (*) [16])(flt0 + lVar4 + 4));
      auVar34._0_12_ = auVar30._0_12_;
      auVar34._12_2_ = auVar30._6_2_;
      auVar34._14_2_ = auVar21._6_2_;
      auVar33._12_4_ = auVar34._12_4_;
      auVar33._0_10_ = auVar30._0_10_;
      auVar33._10_2_ = auVar21._4_2_;
      auVar32._10_6_ = auVar33._10_6_;
      auVar32._0_8_ = auVar30._0_8_;
      auVar32._8_2_ = auVar30._4_2_;
      auVar31._8_8_ = auVar32._8_8_;
      auVar31._6_2_ = auVar21._2_2_;
      auVar31._4_2_ = auVar30._2_2_;
      auVar31._0_2_ = auVar30._0_2_;
      auVar31._2_2_ = auVar21._0_2_;
      auVar36 = pmaddwd(auVar31,auVar24);
      auVar27._2_2_ = auVar21._8_2_;
      auVar27._0_2_ = auVar30._8_2_;
      auVar27._4_2_ = auVar30._10_2_;
      auVar27._6_2_ = auVar21._10_2_;
      auVar27._8_2_ = auVar30._12_2_;
      auVar27._10_2_ = auVar21._12_2_;
      auVar27._12_2_ = auVar30._14_2_;
      auVar27._14_2_ = auVar21._14_2_;
      auVar30 = pmaddwd(auVar27,auVar24);
      auVar35._0_4_ = auVar36._0_4_ + auVar17._0_4_ >> 0xb;
      auVar35._4_4_ = auVar36._4_4_ + auVar17._4_4_ >> 0xb;
      auVar35._8_4_ = auVar36._8_4_ + auVar17._8_4_ >> 0xb;
      auVar35._12_4_ = auVar36._12_4_ + auVar17._12_4_ >> 0xb;
      auVar28._0_4_ = auVar30._0_4_ + auVar17._0_4_ >> 0xb;
      auVar28._4_4_ = auVar30._4_4_ + auVar17._4_4_ >> 0xb;
      auVar28._8_4_ = auVar30._8_4_ + auVar17._8_4_ >> 0xb;
      auVar28._12_4_ = auVar30._12_4_ + auVar17._12_4_ >> 0xb;
      auVar30 = packssdw(auVar35,auVar28);
      auVar23._0_2_ = (auVar21._0_2_ - in_XMM5._0_2_) + auVar30._0_2_;
      auVar23._2_2_ = (auVar21._2_2_ - in_XMM5._2_2_) + auVar30._2_2_;
      auVar23._4_2_ = (auVar21._4_2_ - in_XMM5._4_2_) + auVar30._4_2_;
      auVar23._6_2_ = (auVar21._6_2_ - in_XMM5._6_2_) + auVar30._6_2_;
      auVar23._8_2_ = (auVar21._8_2_ - in_XMM5._8_2_) + auVar30._8_2_;
      auVar23._10_2_ = (auVar21._10_2_ - in_XMM5._10_2_) + auVar30._10_2_;
      auVar23._12_2_ = (auVar21._12_2_ - in_XMM5._12_2_) + auVar30._12_2_;
      auVar23._14_2_ = (auVar21._14_2_ - in_XMM5._14_2_) + auVar30._14_2_;
      in_XMM4 = pmaddwd(auVar23,auVar23);
      auVar38._0_4_ = auVar38._0_4_ + in_XMM4._0_4_;
      auVar38._4_4_ = iVar14 + in_XMM4._4_4_;
      auVar38._8_4_ = auVar20._8_4_ + in_XMM4._8_4_;
      auVar38._12_4_ = auVar20._12_4_ + in_XMM4._12_4_;
      lVar4 = lVar4 + 8;
      pbVar8 = pbVar8 + 8;
      piVar9 = piVar9 + 8;
      pbVar6 = pbVar6 + 8;
    }
    for (; lVar4 < width; lVar4 = lVar4 + 1) {
      lVar5 = (long)(int)(((uint)*pbVar6 - (uint)*pbVar8) +
                         ((int)((*piVar9 + (uint)*pbVar6 * -0x10) * uVar7 + 0x400) >> 0xb));
      lVar2 = lVar2 + lVar5 * lVar5;
      pbVar8 = pbVar8 + 1;
      piVar9 = piVar9 + 1;
      pbVar6 = pbVar6 + 1;
    }
    dat8 = dat8 + dat_stride;
    src8 = src8 + src_stride;
    in_XMM4 = pmovsxdq(in_XMM4,auVar38);
    auVar20._0_8_ = auVar38._8_8_;
    auVar21 = pmovsxdq(auVar20,auVar20);
    lVar11 = lVar11 + in_XMM4._0_8_ + auVar21._0_8_;
    lVar12 = lVar12 + in_XMM4._8_8_ + auVar21._8_8_;
    flt0 = flt0 + flt0_stride;
  }
LAB_00355ef3:
  return lVar12 + lVar11 + lVar2;
}

Assistant:

int64_t av1_lowbd_pixel_proj_error_sse4_1(
    const uint8_t *src8, int width, int height, int src_stride,
    const uint8_t *dat8, int dat_stride, int32_t *flt0, int flt0_stride,
    int32_t *flt1, int flt1_stride, int xq[2], const sgr_params_type *params) {
  int i, j, k;
  const int32_t shift = SGRPROJ_RST_BITS + SGRPROJ_PRJ_BITS;
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));
  __m128i sum64 = _mm_setzero_si128();
  const uint8_t *src = src8;
  const uint8_t *dat = dat8;
  int64_t err = 0;
  if (params->r[0] > 0 && params->r[1] > 0) {
    __m128i xq_coeff = pair_set_epi16(xq[0], xq[1]);
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        const __m128i d0 = _mm_cvtepu8_epi16(xx_loadl_64(dat + j));
        const __m128i s0 = _mm_cvtepu8_epi16(xx_loadl_64(src + j));
        const __m128i flt0_16b =
            _mm_packs_epi32(xx_loadu_128(flt0 + j), xx_loadu_128(flt0 + j + 4));
        const __m128i flt1_16b =
            _mm_packs_epi32(xx_loadu_128(flt1 + j), xx_loadu_128(flt1 + j + 4));
        const __m128i u0 = _mm_slli_epi16(d0, SGRPROJ_RST_BITS);
        const __m128i flt0_0_sub_u = _mm_sub_epi16(flt0_16b, u0);
        const __m128i flt1_0_sub_u = _mm_sub_epi16(flt1_16b, u0);
        const __m128i v0 = _mm_madd_epi16(
            xq_coeff, _mm_unpacklo_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m128i v1 = _mm_madd_epi16(
            xq_coeff, _mm_unpackhi_epi16(flt0_0_sub_u, flt1_0_sub_u));
        const __m128i vr0 = _mm_srai_epi32(_mm_add_epi32(v0, rounding), shift);
        const __m128i vr1 = _mm_srai_epi32(_mm_add_epi32(v1, rounding), shift);
        const __m128i e0 =
            _mm_sub_epi16(_mm_add_epi16(_mm_packs_epi32(vr0, vr1), d0), s0);
        const __m128i err0 = _mm_madd_epi16(e0, e0);
        sum32 = _mm_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq[0] * (flt0[k] - u) + xq[1] * (flt1[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt0 += flt0_stride;
      flt1 += flt1_stride;
      const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
      const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum64_0);
      sum64 = _mm_add_epi64(sum64, sum64_1);
    }
  } else if (params->r[0] > 0 || params->r[1] > 0) {
    const int xq_active = (params->r[0] > 0) ? xq[0] : xq[1];
    const __m128i xq_coeff =
        pair_set_epi16(xq_active, -xq_active * (1 << SGRPROJ_RST_BITS));
    const int32_t *flt = (params->r[0] > 0) ? flt0 : flt1;
    const int flt_stride = (params->r[0] > 0) ? flt0_stride : flt1_stride;
    for (i = 0; i < height; ++i) {
      __m128i sum32 = _mm_setzero_si128();
      for (j = 0; j <= width - 8; j += 8) {
        const __m128i d0 = _mm_cvtepu8_epi16(xx_loadl_64(dat + j));
        const __m128i s0 = _mm_cvtepu8_epi16(xx_loadl_64(src + j));
        const __m128i flt_16b =
            _mm_packs_epi32(xx_loadu_128(flt + j), xx_loadu_128(flt + j + 4));
        const __m128i v0 =
            _mm_madd_epi16(xq_coeff, _mm_unpacklo_epi16(flt_16b, d0));
        const __m128i v1 =
            _mm_madd_epi16(xq_coeff, _mm_unpackhi_epi16(flt_16b, d0));
        const __m128i vr0 = _mm_srai_epi32(_mm_add_epi32(v0, rounding), shift);
        const __m128i vr1 = _mm_srai_epi32(_mm_add_epi32(v1, rounding), shift);
        const __m128i e0 =
            _mm_sub_epi16(_mm_add_epi16(_mm_packs_epi32(vr0, vr1), d0), s0);
        const __m128i err0 = _mm_madd_epi16(e0, e0);
        sum32 = _mm_add_epi32(sum32, err0);
      }
      for (k = j; k < width; ++k) {
        const int32_t u = (int32_t)(dat[k] << SGRPROJ_RST_BITS);
        int32_t v = xq_active * (flt[k] - u);
        const int32_t e = ROUND_POWER_OF_TWO(v, shift) + dat[k] - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
      flt += flt_stride;
      const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
      const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
      sum64 = _mm_add_epi64(sum64, sum64_0);
      sum64 = _mm_add_epi64(sum64, sum64_1);
    }
  } else {
    __m128i sum32 = _mm_setzero_si128();
    for (i = 0; i < height; ++i) {
      for (j = 0; j <= width - 16; j += 16) {
        const __m128i d = xx_loadu_128(dat + j);
        const __m128i s = xx_loadu_128(src + j);
        const __m128i d0 = _mm_cvtepu8_epi16(d);
        const __m128i d1 = _mm_cvtepu8_epi16(_mm_srli_si128(d, 8));
        const __m128i s0 = _mm_cvtepu8_epi16(s);
        const __m128i s1 = _mm_cvtepu8_epi16(_mm_srli_si128(s, 8));
        const __m128i diff0 = _mm_sub_epi16(d0, s0);
        const __m128i diff1 = _mm_sub_epi16(d1, s1);
        const __m128i err0 = _mm_madd_epi16(diff0, diff0);
        const __m128i err1 = _mm_madd_epi16(diff1, diff1);
        sum32 = _mm_add_epi32(sum32, err0);
        sum32 = _mm_add_epi32(sum32, err1);
      }
      for (k = j; k < width; ++k) {
        const int32_t e = (int32_t)(dat[k]) - src[k];
        err += ((int64_t)e * e);
      }
      dat += dat_stride;
      src += src_stride;
    }
    const __m128i sum64_0 = _mm_cvtepi32_epi64(sum32);
    const __m128i sum64_1 = _mm_cvtepi32_epi64(_mm_srli_si128(sum32, 8));
    sum64 = _mm_add_epi64(sum64_0, sum64_1);
  }
  int64_t sum[2];
  xx_storeu_128(sum, sum64);
  err += sum[0] + sum[1];
  return err;
}